

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_439749::NameTreeDetails::compareKeys
          (NameTreeDetails *this,QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  char cVar1;
  bool bVar2;
  logic_error *this_00;
  uint uVar3;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_78;
  string as;
  string bs;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_88,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)a);
  cVar1 = (**(code **)((long)*this + 8))(this,&_Stack_88);
  if (cVar1 == '\0') {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)b);
    cVar1 = (**(code **)((long)*this + 8))(this,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
    if (cVar1 != '\0') {
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&as,a);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&bs,b);
      bVar2 = std::operator<(&as,&bs);
      if (bVar2) {
        uVar3 = 0xffffffff;
      }
      else {
        bVar2 = std::operator>(&as,&bs);
        uVar3 = (uint)bVar2;
      }
      std::__cxx11::string::~string((string *)&bs);
      std::__cxx11::string::~string((string *)&as);
      return uVar3;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"comparing invalid keys");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
        compareKeys(QPDFObjectHandle a, QPDFObjectHandle b) const override
        {
            if (!(keyValid(a) && keyValid(b))) {
                // We don't call this without calling keyValid first
                throw std::logic_error("comparing invalid keys");
            }
            auto as = a.getUTF8Value();
            auto bs = b.getUTF8Value();
            return ((as < bs) ? -1 : (as > bs) ? 1 : 0);
        }